

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O2

bool __thiscall
cmRuntimeDependencyArchive::GetRuntimeDependencies
          (cmRuntimeDependencyArchive *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *executables,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libraries,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *modules)

{
  pointer pbVar1;
  cmBinUtilsLinker *pcVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *exe;
  pointer pbVar4;
  long lVar5;
  long lVar6;
  pointer pbVar7;
  
  pbVar4 = (executables->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (executables->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while (pbVar4 != pbVar1) {
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar4,0);
    pbVar4 = pbVar4 + 1;
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  pbVar4 = (libraries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (libraries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while (pbVar4 != pbVar1) {
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar4,2);
    pbVar4 = pbVar4 + 1;
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  pbVar4 = (modules->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (modules->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pbVar1 - (long)pbVar4;
  for (lVar6 = lVar5 >> 7; 0 < lVar6; lVar6 = lVar6 + -1) {
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar4,3);
    pbVar7 = pbVar4;
    if ((char)iVar3 == '\0') goto LAB_004a0bdc;
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar4 + 1,3);
    pbVar7 = pbVar4 + 1;
    if ((char)iVar3 == '\0') goto LAB_004a0bdc;
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar4 + 2,3);
    pbVar7 = pbVar4 + 2;
    if ((char)iVar3 == '\0') goto LAB_004a0bdc;
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar4 + 3,3);
    pbVar7 = pbVar4 + 3;
    if ((char)iVar3 == '\0') goto LAB_004a0bdc;
    pbVar4 = pbVar4 + 4;
    lVar5 = lVar5 + -0x80;
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pbVar7 = pbVar1;
      if ((lVar5 != 3) ||
         (pcVar2 = (this->Linker)._M_t.
                   super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>
                   .super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl,
         iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar4,3), pbVar7 = pbVar4,
         (char)iVar3 == '\0')) goto LAB_004a0bdc;
      pbVar4 = pbVar4 + 1;
    }
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar4,3);
    pbVar7 = pbVar4;
    if ((char)iVar3 == '\0') goto LAB_004a0bdc;
    pbVar4 = pbVar4 + 1;
  }
  pcVar2 = (this->Linker)._M_t.
           super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
           super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
           super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
  iVar3 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar4,3);
  pbVar7 = pbVar4;
  if ((char)iVar3 != '\0') {
    pbVar7 = pbVar1;
  }
LAB_004a0bdc:
  return pbVar7 == pbVar1;
}

Assistant:

bool cmRuntimeDependencyArchive::GetRuntimeDependencies(
  const std::vector<std::string>& executables,
  const std::vector<std::string>& libraries,
  const std::vector<std::string>& modules)
{
  for (auto const& exe : executables) {
    if (!this->Linker->ScanDependencies(exe, cmStateEnums::EXECUTABLE)) {
      return false;
    }
  }
  for (auto const& lib : libraries) {
    if (!this->Linker->ScanDependencies(lib, cmStateEnums::SHARED_LIBRARY)) {
      return false;
    }
  }
  return std::all_of(
    modules.begin(), modules.end(), [this](std::string const& mod) -> bool {
      return this->Linker->ScanDependencies(mod, cmStateEnums::MODULE_LIBRARY);
    });
}